

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

int multi_getsock(Curl_easy *data,curl_socket_t *socks)

{
  ssl_connect_state sVar1;
  connectdata *conn;
  _func_int_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  conn = data->conn;
  iVar2 = 0;
  if (conn == (connectdata *)0x0) {
    return 0;
  }
  uVar4 = data->mstate - CURLM_STATE_WAITRESOLVE;
  if (uVar4 < 0xc) {
    conn->data = data;
  }
  switch(uVar4) {
  case 0:
    iVar2 = Curl_resolv_getsock(conn,socks);
    return iVar2;
  case 1:
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       ((conn->bits).proxy_ssl_connected[0] == false)) {
      sVar1 = conn->ssl[0].connecting_state;
      if (sVar1 == ssl_connect_2_writing) {
        iVar2 = 0x10000;
      }
      else {
        if (sVar1 != ssl_connect_2_reading) {
          return 0;
        }
        iVar2 = 1;
      }
      *socks = conn->sock[0];
      return iVar2;
    }
    if (0xf < (conn->cnnct).state - CONNECT_SOCKS_INIT) {
      iVar2 = 0;
      uVar4 = 0;
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        if (conn->tempsock[lVar3] != -1) {
          socks[iVar2] = conn->tempsock[lVar3];
          uVar4 = uVar4 | 1 << (iVar2 + 0x10U & 0x1f);
          iVar2 = iVar2 + 1;
        }
      }
      return uVar4;
    }
    iVar2 = Curl_SOCKS_getsock(conn,socks,0);
    return iVar2;
  case 2:
    *socks = conn->sock[0];
    iVar2 = 1;
    if (conn->connect_state == (http_connect_state *)0x0) {
      iVar2 = 0x10000;
    }
    break;
  case 3:
  case 4:
    UNRECOVERED_JUMPTABLE = conn->handler->proto_getsock;
    if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr *)0x0) {
      iVar2 = (*UNRECOVERED_JUMPTABLE)(conn,socks);
      return iVar2;
    }
    *socks = conn->sock[0];
    return 0x10001;
  case 5:
  case 6:
    UNRECOVERED_JUMPTABLE = conn->handler->doing_getsock;
    if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr *)0x0) {
      iVar2 = (*UNRECOVERED_JUMPTABLE)(conn,socks);
      return iVar2;
    }
    break;
  case 7:
    UNRECOVERED_JUMPTABLE = conn->handler->domore_getsock;
    if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr *)0x0) {
      iVar2 = (*UNRECOVERED_JUMPTABLE)(conn,socks);
      return iVar2;
    }
    break;
  case 8:
  case 9:
    iVar2 = Curl_single_getsock(conn,socks);
    return iVar2;
  }
  return iVar2;
}

Assistant:

static int multi_getsock(struct Curl_easy *data,
                         curl_socket_t *socks)
{
  /* The no connection case can happen when this is called from
     curl_multi_remove_handle() => singlesocket() => multi_getsock().
  */
  if(!data->conn)
    return 0;

  if(data->mstate > CURLM_STATE_CONNECT &&
     data->mstate < CURLM_STATE_COMPLETED) {
    /* Set up ownership correctly */
    data->conn->data = data;
  }

  switch(data->mstate) {
  default:
#if 0 /* switch back on these cases to get the compiler to check for all enums
         to be present */
  case CURLM_STATE_TOOFAST:  /* returns 0, so will not select. */
  case CURLM_STATE_COMPLETED:
  case CURLM_STATE_MSGSENT:
  case CURLM_STATE_INIT:
  case CURLM_STATE_CONNECT:
  case CURLM_STATE_WAITDO:
  case CURLM_STATE_DONE:
  case CURLM_STATE_LAST:
    /* this will get called with CURLM_STATE_COMPLETED when a handle is
       removed */
#endif
    return 0;

  case CURLM_STATE_WAITRESOLVE:
    return Curl_resolv_getsock(data->conn, socks);

  case CURLM_STATE_PROTOCONNECT:
  case CURLM_STATE_SENDPROTOCONNECT:
    return protocol_getsock(data->conn, socks);

  case CURLM_STATE_DO:
  case CURLM_STATE_DOING:
    return doing_getsock(data->conn, socks);

  case CURLM_STATE_WAITPROXYCONNECT:
    return waitproxyconnect_getsock(data->conn, socks);

  case CURLM_STATE_WAITCONNECT:
    return waitconnect_getsock(data->conn, socks);

  case CURLM_STATE_DO_MORE:
    return domore_getsock(data->conn, socks);

  case CURLM_STATE_DO_DONE: /* since is set after DO is completed, we switch
                               to waiting for the same as the *PERFORM
                               states */
  case CURLM_STATE_PERFORM:
    return Curl_single_getsock(data->conn, socks);
  }

}